

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_signparameter.cpp
# Opt level: O2

void __thiscall
SignParameter_SignDataConstructorTest_Test::SignParameter_SignDataConstructorTest_Test
          (SignParameter_SignDataConstructorTest_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_002a0678;
  return;
}

Assistant:

TEST(SignParameter, SignDataConstructorTest)
{
  const ByteData expect_message("773420c0ded41a55b1f1205cfb632f08f3f911a53e7338a0dac73ec6cbe3ca471907434d046185abedc5afddc2761a642bccc70af6d22b46394f1d04a8b24226");
  const SigHashType expect_sighashtype(SigHashAlgorithm::kSigHashAll);
  const ByteData expect_signature("30440220773420c0ded41a55b1f1205cfb632f08f3f911a53e7338a0dac73ec6cbe3ca4702201907434d046185abedc5afddc2761a642bccc70af6d22b46394f1d04a8b2422601");
  // constructor
  SignParameter sign_parameter = SignParameter(expect_message, true);
  CompareSignparameter(sign_parameter, expect_message,
      SignDataType::kSign, Pubkey(), true, expect_sighashtype,
      expect_signature);
}